

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

__m128i highbd_filter_block(__m128i a,__m128i b,__m128i filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_EDX;
  longlong in_RSI;
  undefined8 in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i alVar7;
  __m128i v_val_d;
  __m128i v_val_d_00;
  __m128i v1;
  __m128i v0;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined2 uStack_30;
  undefined2 uStack_2e;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  
  local_58 = (undefined2)in_XMM0_Qa;
  uStack_56 = (undefined2)((ulong)in_XMM0_Qa >> 0x10);
  uStack_54 = (undefined2)((ulong)in_XMM0_Qa >> 0x20);
  uStack_52 = (undefined2)((ulong)in_XMM0_Qa >> 0x30);
  local_68 = (undefined2)in_XMM1_Qa;
  uStack_66 = (undefined2)((ulong)in_XMM1_Qa >> 0x10);
  uStack_64 = (undefined2)((ulong)in_XMM1_Qa >> 0x20);
  uStack_62 = (undefined2)((ulong)in_XMM1_Qa >> 0x30);
  local_e8._0_4_ = CONCAT22(local_68,local_58);
  local_e8._0_6_ = CONCAT24(uStack_56,(undefined4)local_e8);
  local_e8 = CONCAT26(uStack_66,(undefined6)local_e8);
  uStack_e0._0_2_ = uStack_54;
  uStack_e0._2_2_ = uStack_64;
  uStack_e0._4_2_ = uStack_52;
  uStack_e0._6_2_ = uStack_62;
  auVar4._8_8_ = uStack_e0;
  auVar4._0_8_ = local_e8;
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = in_XMM2_Qa;
  pmaddwd(auVar4,auVar3);
  v_val_d[1] = in_RSI;
  v_val_d[0] = 7;
  alVar7 = xx_roundn_epu32(v_val_d,in_EDX);
  uStack_30 = (undefined2)in_XMM0_Qb;
  uStack_2e = (undefined2)((ulong)in_XMM0_Qb >> 0x10);
  uStack_2c = (undefined2)((ulong)in_XMM0_Qb >> 0x20);
  uStack_2a = (undefined2)((ulong)in_XMM0_Qb >> 0x30);
  uStack_40 = (undefined2)in_XMM1_Qb;
  uStack_3e = (undefined2)((ulong)in_XMM1_Qb >> 0x10);
  uStack_3c = (undefined2)((ulong)in_XMM1_Qb >> 0x20);
  uStack_3a = (undefined2)((ulong)in_XMM1_Qb >> 0x30);
  local_f8._0_4_ = CONCAT22(uStack_40,uStack_30);
  local_f8._0_6_ = CONCAT24(uStack_2e,(undefined4)local_f8);
  local_f8 = CONCAT26(uStack_3e,(undefined6)local_f8);
  uStack_f0._0_2_ = uStack_2c;
  uStack_f0._2_2_ = uStack_3c;
  uStack_f0._4_2_ = uStack_2a;
  uStack_f0._6_2_ = uStack_3a;
  auVar2._8_8_ = uStack_f0;
  auVar2._0_8_ = local_f8;
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = in_XMM2_Qa;
  pmaddwd(auVar2,auVar1);
  v_val_d_00[1] = in_RSI;
  v_val_d_00[0] = 7;
  alVar7 = xx_roundn_epu32(v_val_d_00,(int)alVar7[1]);
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_8_ = extraout_XMM0_Qa;
  auVar5._8_8_ = extraout_XMM0_Qb_00;
  auVar5._0_8_ = extraout_XMM0_Qa_00;
  packssdw(auVar6,auVar5);
  alVar7[0] = alVar7[0];
  alVar7[1] = alVar7[1];
  return alVar7;
}

Assistant:

static inline __m128i highbd_filter_block(const __m128i a, const __m128i b,
                                          const __m128i filter) {
  __m128i v0 = _mm_unpacklo_epi16(a, b);
  v0 = _mm_madd_epi16(v0, filter);
  v0 = xx_roundn_epu32(v0, FILTER_BITS);

  __m128i v1 = _mm_unpackhi_epi16(a, b);
  v1 = _mm_madd_epi16(v1, filter);
  v1 = xx_roundn_epu32(v1, FILTER_BITS);

  return _mm_packs_epi32(v0, v1);
}